

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapMerge(Ivy_Supp_t *pSupp0,Ivy_Supp_t *pSupp1,Ivy_Supp_t *pSupp,int nLimit)

{
  char cVar1;
  int local_38;
  int local_34;
  int c;
  int k;
  int i;
  int nLimit_local;
  Ivy_Supp_t *pSupp_local;
  Ivy_Supp_t *pSupp1_local;
  Ivy_Supp_t *pSupp0_local;
  
  if (pSupp0->nSize < pSupp1->nSize) {
    __assert_fail("pSupp0->nSize >= pSupp1->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                  ,0x2c6,"int Ivy_FastMapMerge(Ivy_Supp_t *, Ivy_Supp_t *, Ivy_Supp_t *, int)");
  }
  if ((pSupp0->nSize == nLimit) && (pSupp1->nSize == nLimit)) {
    for (c = 0; c < pSupp0->nSize; c = c + 1) {
      if (*(int *)(&pSupp0[1].nSize + (long)c * 4) != *(int *)(&pSupp1[1].nSize + (long)c * 4)) {
        return 0;
      }
    }
    for (c = 0; c < pSupp0->nSize; c = c + 1) {
      *(undefined4 *)(&pSupp[1].nSize + (long)c * 4) =
           *(undefined4 *)(&pSupp0[1].nSize + (long)c * 4);
    }
    pSupp->nSize = pSupp0->nSize;
    pSupp0_local._4_4_ = 1;
  }
  else if (pSupp0->nSize == nLimit) {
    for (c = 0; c < pSupp1->nSize; c = c + 1) {
      local_34 = (int)pSupp0->nSize;
      do {
        local_34 = local_34 + -1;
        if (local_34 < 0) break;
      } while (*(int *)(&pSupp0[1].nSize + (long)local_34 * 4) !=
               *(int *)(&pSupp1[1].nSize + (long)c * 4));
      if (local_34 == -1) {
        return 0;
      }
    }
    for (c = 0; c < pSupp0->nSize; c = c + 1) {
      *(undefined4 *)(&pSupp[1].nSize + (long)c * 4) =
           *(undefined4 *)(&pSupp0[1].nSize + (long)c * 4);
    }
    pSupp->nSize = pSupp0->nSize;
    pSupp0_local._4_4_ = 1;
  }
  else {
    local_34 = 0;
    c = 0;
    for (local_38 = 0; cVar1 = (char)local_38, local_38 < nLimit; local_38 = local_38 + 1) {
      if (local_34 == pSupp1->nSize) {
        if (c == pSupp0->nSize) {
          pSupp->nSize = cVar1;
          return 1;
        }
        *(undefined4 *)(&pSupp[1].nSize + (long)local_38 * 4) =
             *(undefined4 *)(&pSupp0[1].nSize + (long)c * 4);
        c = c + 1;
      }
      else if (c == pSupp0->nSize) {
        if (local_34 == pSupp1->nSize) {
          pSupp->nSize = cVar1;
          return 1;
        }
        *(undefined4 *)(&pSupp[1].nSize + (long)local_38 * 4) =
             *(undefined4 *)(&pSupp1[1].nSize + (long)local_34 * 4);
        local_34 = local_34 + 1;
      }
      else if (*(int *)(&pSupp0[1].nSize + (long)c * 4) <
               *(int *)(&pSupp1[1].nSize + (long)local_34 * 4)) {
        *(undefined4 *)(&pSupp[1].nSize + (long)local_38 * 4) =
             *(undefined4 *)(&pSupp0[1].nSize + (long)c * 4);
        c = c + 1;
      }
      else if (*(int *)(&pSupp1[1].nSize + (long)local_34 * 4) <
               *(int *)(&pSupp0[1].nSize + (long)c * 4)) {
        *(undefined4 *)(&pSupp[1].nSize + (long)local_38 * 4) =
             *(undefined4 *)(&pSupp1[1].nSize + (long)local_34 * 4);
        local_34 = local_34 + 1;
      }
      else {
        *(undefined4 *)(&pSupp[1].nSize + (long)local_38 * 4) =
             *(undefined4 *)(&pSupp0[1].nSize + (long)c * 4);
        local_34 = local_34 + 1;
        c = c + 1;
      }
    }
    if ((c < pSupp0->nSize) || (local_34 < pSupp1->nSize)) {
      pSupp0_local._4_4_ = 0;
    }
    else {
      pSupp->nSize = cVar1;
      pSupp0_local._4_4_ = 1;
    }
  }
  return pSupp0_local._4_4_;
}

Assistant:

int Ivy_FastMapMerge( Ivy_Supp_t * pSupp0, Ivy_Supp_t * pSupp1, Ivy_Supp_t * pSupp, int nLimit )
{ 
    int i, k, c;
    assert( pSupp0->nSize >= pSupp1->nSize );
    // the case of the largest cut sizes
    if ( pSupp0->nSize == nLimit && pSupp1->nSize == nLimit )
    {
        for ( i = 0; i < pSupp0->nSize; i++ )
            if ( pSupp0->pArray[i] != pSupp1->pArray[i] )
                return 0;
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pSupp0->nSize == nLimit )
    {
        for ( i = 0; i < pSupp1->nSize; i++ )
        {
            for ( k = pSupp0->nSize - 1; k >= 0; k-- )
                if ( pSupp0->pArray[k] == pSupp1->pArray[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < nLimit; c++ )
    {
        if ( k == pSupp1->nSize )
        {
            if ( i == pSupp0->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( i == pSupp0->nSize )
        {
            if ( k == pSupp1->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        if ( pSupp0->pArray[i] < pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( pSupp0->pArray[i] > pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        pSupp->pArray[c] = pSupp0->pArray[i++]; 
        k++;
    }
    if ( i < pSupp0->nSize || k < pSupp1->nSize )
        return 0;
    pSupp->nSize = c;
    return 1;
}